

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::argSynopsis
          (CommandLine<Catch::ConfigData> *this,ostream *os)

{
  const_iterator cVar1;
  ostream *poVar2;
  logic_error *this_00;
  string *psVar3;
  allocator local_55;
  int local_54;
  string local_50 [32];
  
  local_54 = 1;
  do {
    if (this->m_highestSpecifiedArgPosition < local_54) {
      if ((this->m_floatingArg)._M_ptr != (Arg *)0x0) {
        if (1 < this->m_highestSpecifiedArgPosition) {
          std::operator<<(os," ");
        }
        poVar2 = std::operator<<(os,"[<");
        poVar2 = std::operator<<(poVar2,(string *)
                                        &(((this->m_floatingArg)._M_ptr)->
                                         super_CommonArgProperties<Catch::ConfigData>).placeholder);
        std::operator<<(poVar2,"> ...]");
      }
      return;
    }
    if (1 < local_54) {
      std::operator<<(os," ");
    }
    cVar1 = std::
            _Rb_tree<int,_std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>,_std::_Select1st<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
            ::find(&(this->m_positionalArgs)._M_t,&local_54);
    if ((_Rb_tree_header *)cVar1._M_node ==
        &(this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header) {
      if ((this->m_floatingArg)._M_ptr == (Arg *)0x0) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  (local_50,"non consecutive positional arguments with no floating args",&local_55);
        std::logic_error::logic_error(this_00,local_50);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      poVar2 = std::operator<<(os,"<");
      psVar3 = (string *)
               &(((this->m_floatingArg)._M_ptr)->super_CommonArgProperties<Catch::ConfigData>).
                placeholder;
    }
    else {
      poVar2 = std::operator<<(os,"<");
      psVar3 = (string *)&cVar1._M_node[3]._M_left;
    }
    poVar2 = std::operator<<(poVar2,psVar3);
    std::operator<<(poVar2,">");
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void argSynopsis( std::ostream& os ) const {
            for( int i = 1; i <= m_highestSpecifiedArgPosition; ++i ) {
                if( i > 1 )
                    os << " ";
                typename std::map<int, Arg>::const_iterator it = m_positionalArgs.find( i );
                if( it != m_positionalArgs.end() )
                    os << "<" << it->second.placeholder << ">";
                else if( m_floatingArg.get() )
                    os << "<" << m_floatingArg->placeholder << ">";
                else
                    throw std::logic_error( "non consecutive positional arguments with no floating args" );
            }
            // !TBD No indication of mandatory args
            if( m_floatingArg.get() ) {
                if( m_highestSpecifiedArgPosition > 1 )
                    os << " ";
                os << "[<" << m_floatingArg->placeholder << "> ...]";
            }
        }